

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

void anon_unknown.dwarf_101d8b::Flanger_getParami(EffectProps *props,ALenum param,int *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  
  if (in_ESI == 1) {
    *in_RDX = *in_RDI;
  }
  else {
    if (in_ESI != 2) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid flanger integer property 0x%04x",(ulong)in_ESI);
      __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDX = in_RDI[1];
  }
  return;
}

Assistant:

void Flanger_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_FLANGER_WAVEFORM:
        *val = props->Chorus.Waveform;
        break;

    case AL_FLANGER_PHASE:
        *val = props->Chorus.Phase;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid flanger integer property 0x%04x", param};
    }
}